

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glBindProgram(MOJOSHADER_glProgram *program)

{
  MOJOSHADER_glContext *pMVar1;
  
  pMVar1 = ctx;
  if (ctx->bound_program != program) {
    if (program == (MOJOSHADER_glProgram *)0x0) {
      memset(ctx->want_attr,0,(long)ctx->max_attrs);
      update_enabled_arrays();
      pMVar1 = ctx;
    }
    else {
      program->refcount = program->refcount + 1;
      memset(pMVar1->want_attr,0,(long)pMVar1->max_attrs);
    }
    (*pMVar1->profileUseProgram)(program);
    program_unref(ctx->bound_program);
    ctx->bound_program = program;
  }
  return;
}

Assistant:

void MOJOSHADER_glBindProgram(MOJOSHADER_glProgram *program)
{
    if (program == ctx->bound_program)
        return;  // nothing to do.

    if (program != NULL)
        program->refcount++;

    memset(ctx->want_attr, '\0', sizeof (ctx->want_attr[0]) * ctx->max_attrs);

    // If no program bound, disable all arrays, in case we're switching to
    //  fixed function pipeline. Otherwise, we try to minimize state changes
    //  by toggling just the changed set of needed arrays in ProgramReady().
    if (program == NULL)
        update_enabled_arrays();

    ctx->profileUseProgram(program);
    program_unref(ctx->bound_program);
    ctx->bound_program = program;
}